

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

void __thiscall correctness_xor__Test::~correctness_xor__Test(correctness_xor__Test *this)

{
  correctness_xor__Test *this_local;
  
  ~correctness_xor__Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(correctness, xor_) {
    big_integer a = 0xaa;
    big_integer b = 0xcc;

    EXPECT_TRUE((a ^ b) == 0x66);

    big_integer c = 0x55;
    big_integer d = 0xcc;
    EXPECT_EQ(big_integer(0x99), c ^ d);
}